

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::benchmarkPreparing(ConsoleReporter *this,string *name)

{
  TablePrinter *pTVar1;
  bool bVar2;
  string line;
  iterator __begin1;
  Column nameCol;
  string local_b0;
  iterator local_90;
  Column local_60;
  
  lazyPrintWithoutClosingBenchmarkTable(this);
  clara::TextFlow::Column::Column((Column *)&local_90,name);
  local_90.m_len =
       (long)*(int *)(*(long *)&(((this->m_tablePrinter)._M_t.
                                  super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                                  .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl)
                                ->m_columnInfos).
                                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                                ._M_impl + 0x20) - 2;
  if ((int)local_90.m_len != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_90);
    local_60.m_initialIndent = local_90._40_8_;
    local_60.m_width = local_90.m_len;
    local_60.m_indent = local_90.m_end;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_90);
    clara::TextFlow::Column::iterator::iterator(&local_90,&local_60);
    bVar2 = true;
    while (((local_90.m_pos != 0 ||
            (local_90.m_stringIndex !=
             (long)local_60.m_strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.m_strings.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5)) ||
           (local_90.m_column != &local_60))) {
      clara::TextFlow::Column::iterator::operator*[abi_cxx11_(&local_b0,&local_90);
      if (!bVar2) {
        pTVar1 = (this->m_tablePrinter)._M_t.
                 super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
                 .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
        operator<<(pTVar1);
        operator<<(pTVar1);
        operator<<(pTVar1);
      }
      pTVar1 = (this->m_tablePrinter)._M_t.
               super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>
               ._M_t.
               super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
               .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pTVar1->m_oss,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      operator<<(pTVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      bVar2 = false;
      clara::TextFlow::Column::iterator::operator++(&local_90);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_60);
    return;
  }
  __assert_fail("newWidth > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                ,0x21b0,"Column &Catch::clara::TextFlow::Column::width(size_t)");
}

Assistant:

void ConsoleReporter::benchmarkPreparing(std::string const& name) {
	lazyPrintWithoutClosingBenchmarkTable();

	auto nameCol = Column(name).width(static_cast<std::size_t>(m_tablePrinter->columnInfos()[0].width - 2));

	bool firstLine = true;
	for (auto line : nameCol) {
		if (!firstLine)
			(*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
		else
			firstLine = false;

		(*m_tablePrinter) << line << ColumnBreak();
	}
}